

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RunLength.cc
# Opt level: O3

void __thiscall Pl_RunLength::~Pl_RunLength(Pl_RunLength *this)

{
  ~Pl_RunLength(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Pl_RunLength::~Pl_RunLength() // NOLINT (modernize-use-equals-default)
{
    // Must be explicit and not inline -- see QPDF_DLL_CLASS in README-maintainer
}